

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ResolveSelectNames(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  long in_FS_OFFSET;
  undefined1 local_38 [40];
  anon_union_8_18_67db040d_for_u local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = resolveExprStep;
  local_38._16_8_ = resolveSelectStep;
  local_38._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_38._0_8_ = pParse;
  local_10.pNC = pOuterNC;
  sqlite3WalkSelect((Walker *)local_38,p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ResolveSelectNames(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for parent SELECT statement */
){
  Walker w;

  assert( p!=0 );
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.pParse = pParse;
  w.u.pNC = pOuterNC;
  sqlite3WalkSelect(&w, p);
}